

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int32_t nghttp2_session_get_stream_remote_window_size(nghttp2_session *session,int32_t stream_id)

{
  int iVar1;
  void *pvVar2;
  
  pvVar2 = nghttp2_map_find(&session->streams,stream_id);
  if ((pvVar2 == (void *)0x0) || ((*(byte *)((long)pvVar2 + 0xd8) & 2) != 0)) {
    pvVar2 = (void *)0x0;
  }
  else if (*(int *)((long)pvVar2 + 0xcc) == 5) {
    pvVar2 = (void *)0x0;
  }
  if (pvVar2 == (void *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    if (0 < *(int *)((long)pvVar2 + 0xac)) {
      iVar1 = *(int *)((long)pvVar2 + 0xac);
    }
  }
  return iVar1;
}

Assistant:

int32_t nghttp2_session_get_stream_remote_window_size(nghttp2_session *session,
                                                      int32_t stream_id) {
  nghttp2_stream *stream;

  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream == NULL) {
    return -1;
  }

  /* stream->remote_window_size can be negative when
     SETTINGS_INITIAL_WINDOW_SIZE is changed. */
  return nghttp2_max(0, stream->remote_window_size);
}